

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-uri.cpp
# Opt level: O3

ostream * nlohmann::operator<<(ostream *os,json_uri *u)

{
  ostream *poVar1;
  string local_30;
  
  json_uri::to_string_abi_cxx11_(&local_30,u);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const json_uri &u)
{
	return os << u.to_string();
}